

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_1(void)

{
  Calc *this;
  pointer *__ptr;
  double a;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  Calc *local_38;
  string local_30;
  
  DefaultCalc();
  this = local_38;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1 2 3 42","");
  a = Calc::eval(this,&local_30);
  AssertEqD(a,42.0,0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != (Calc *)0x0) {
    std::default_delete<Calc>::operator()((default_delete<Calc> *)&local_38,local_38);
  }
  return;
}

Assistant:

void test_1() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("1 2 3 42"), 42.0, __LINE__);
}